

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O1

_Bool X86_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *_info)

{
  cs_detail *pcVar1;
  cs_insn *pcVar2;
  DisassemblerMode mode;
  _Bool _Var3;
  uint8_t uVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  x86_reg xVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint Op;
  undefined8 uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  InternalInstruction insn;
  uint8_t *local_198;
  size_t local_190;
  uint64_t local_188;
  InternalInstruction local_180;
  
  memset(&local_180,0,0x150);
  pcVar1 = instr->flat_insn->detail;
  local_198 = code;
  local_190 = code_len;
  local_188 = address;
  if (pcVar1 != (cs_detail *)0x0) {
    memset(pcVar1,0,0x228);
  }
  mode = ((*(uint *)(ud + 4) & 4) == 0) + MODE_32BIT;
  if ((*(uint *)(ud + 4) & 2) != 0) {
    mode = MODE_16BIT;
  }
  iVar6 = decodeInstruction(&local_180,reader,&local_198,address,mode);
  if (iVar6 != 0) {
    uVar5 = (uint16_t)(local_180.readerCursor - address);
    *size = uVar5;
    if (uVar5 == 4) {
      if (*(int *)(ud + 4) == 2) {
        return false;
      }
      uVar14 = address - local_188;
      if (uVar14 < local_190) {
        uVar4 = local_198[uVar14];
      }
      else {
        uVar4 = '\0';
      }
      if (uVar14 + 1 < local_190) {
        uVar9 = local_198[uVar14 + 1];
      }
      else {
        uVar9 = '\0';
      }
      if (uVar14 + 2 < local_190) {
        uVar10 = local_198[uVar14 + 2];
      }
      else {
        uVar10 = '\0';
      }
      if (uVar14 + 3 < local_190) {
        uVar11 = local_198[uVar14 + 3];
      }
      else {
        uVar11 = '\0';
      }
      if ((uVar10 != '\x1e' || (uVar9 != '\x0f' || uVar4 != 0xf3)) || (uVar11 != 0xfa)) {
        if ((uVar10 != '\x1e' || (uVar9 != '\x0f' || uVar4 != 0xf3)) || uVar11 != 0xfb) {
          return false;
        }
        instr->Opcode = 0x2296;
        instr->OpcodePub = 0x5db;
        uVar12 = 0x32337262646e65;
      }
      else {
        instr->Opcode = 0x2297;
        instr->OpcodePub = 0x5dc;
        uVar12 = 0x34367262646e65;
      }
      *(undefined8 *)instr->assembly = uVar12;
      pcVar1 = instr->flat_insn->detail;
      if (pcVar1 != (cs_detail *)0x0) {
        (pcVar1->field_6).x86.opcode[0] = uVar4;
        (instr->flat_insn->detail->field_6).x86.opcode[1] = uVar9;
        (instr->flat_insn->detail->field_6).x86.opcode[2] = uVar10;
        (instr->flat_insn->detail->field_6).x86.opcode[3] = uVar11;
        return true;
      }
      return true;
    }
    if (((uint)(local_180.readerCursor - address) & 0xffff) != 2) {
      return false;
    }
    uVar14 = address - local_188;
    if (uVar14 < local_190) {
      uVar4 = local_198[uVar14];
    }
    else {
      uVar4 = '\0';
    }
    if (uVar14 + 1 < local_190) {
      uVar9 = local_198[uVar14 + 1];
    }
    else {
      uVar9 = '\0';
    }
    bVar15 = uVar9 == 0xff && uVar4 == '\x0f';
    if (uVar9 == 0xff && uVar4 == '\x0f') {
      instr->Opcode = 0x2295;
      instr->OpcodePub = 0x5da;
      builtin_strncpy(instr->assembly,"ud0",4);
      pcVar1 = instr->flat_insn->detail;
      if (pcVar1 != (cs_detail *)0x0) {
        (pcVar1->field_6).x86.opcode[0] = uVar4;
        (instr->flat_insn->detail->field_6).x86.opcode[1] = uVar9;
        return bVar15;
      }
      return bVar15;
    }
    return bVar15;
  }
  *size = (uint16_t)local_180.length;
  bVar15 = true;
  if (local_180.spec == (InstructionSpecifier *)0x0) goto LAB_0023a5fa;
  MCInst_setOpcode(instr,(uint)local_180.instructionID);
  if (local_180.xAcquireRelease == true) {
    uVar7 = MCInst_getOpcode(instr);
    Op = 0x2281;
    if (uVar7 != 0x980) {
      uVar7 = MCInst_getOpcode(instr);
      Op = 0x2238;
      if (uVar7 != 0x978) goto LAB_0023a5bc;
    }
    MCInst_setOpcode(instr,Op);
  }
LAB_0023a5bc:
  local_180.numImmediatesTranslated = '\0';
  lVar13 = 0;
  do {
    if (((&(local_180.operands)->encoding)[lVar13] != '\0') &&
       (_Var3 = translateOperand(instr,(OperandSpecifier *)
                                       (&(local_180.operands)->encoding + lVar13),&local_180), _Var3
       )) goto LAB_0023a5fa;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 0xc);
  bVar15 = false;
LAB_0023a5fa:
  _Var3 = (_Bool)(bVar15 ^ 1);
  if (bVar15) {
    return _Var3;
  }
  if ((((*(byte *)(ud + 4) & 8) != 0) && (uVar7 = instr->Opcode - 0x4c3, uVar7 < 0x1c)) &&
     ((0xc000003U >> (uVar7 & 0x1f) & 1) != 0)) {
    return false;
  }
  instr->imm_size = local_180.immSize;
  if (*(int *)(ud + 0x60) == 0) {
    instr->x86_prefix[0] = local_180.prefix0;
    instr->x86_prefix[1] = local_180.prefix1;
    instr->x86_prefix[2] = local_180.prefix2;
    instr->x86_prefix[3] = local_180.prefix3;
    return _Var3;
  }
  pcVar2 = instr->flat_insn;
  instr->x86_prefix[0] = local_180.prefix0;
  instr->x86_prefix[1] = local_180.prefix1;
  instr->x86_prefix[2] = local_180.prefix2;
  instr->x86_prefix[3] = local_180.prefix3;
  if (local_180.vectorExtensionType == TYPE_NO_VEX_XOP) {
    if (local_180.twoByteEscape == '\0') {
      (pcVar2->detail->field_6).x86.opcode[0] = local_180.opcode;
    }
    else {
      (pcVar2->detail->field_6).x86.opcode[0] = local_180.twoByteEscape;
      if (local_180.threeByteEscape == '\0') {
        (pcVar2->detail->field_6).x86.opcode[1] = local_180.opcode;
      }
      else {
        (pcVar2->detail->field_6).x86.opcode[1] = local_180.threeByteEscape;
        (pcVar2->detail->field_6).x86.opcode[2] = local_180.opcode;
      }
    }
  }
  else {
    (pcVar2->detail->field_6).arm.vector_size = (int)local_180.vectorExtensionPrefix;
  }
  (pcVar2->detail->field_6).x86.rex = local_180.rexPrefix;
  (pcVar2->detail->field_6).x86.addr_size = local_180.addressSize;
  (pcVar2->detail->field_6).x86.modrm = local_180.orgModRM;
  (pcVar2->detail->field_6).x86.encoding.modrm_offset = local_180.modRMOffset;
  (pcVar2->detail->field_6).x86.sib = local_180.sib;
  xVar8 = x86_map_sib_index(local_180.sibIndex);
  (pcVar2->detail->field_6).x86.sib_index = xVar8;
  (pcVar2->detail->field_6).x86.sib_scale = local_180.sibScale;
  xVar8 = x86_map_sib_base(local_180.sibBase);
  (pcVar2->detail->field_6).x86.sib_base = xVar8;
  (pcVar2->detail->field_6).x86.disp = local_180.displacement;
  if (local_180.consumedDisplacement == true) {
    (pcVar2->detail->field_6).x86.encoding.disp_offset = local_180.displacementOffset;
    (pcVar2->detail->field_6).x86.encoding.disp_size = local_180.displacementSize;
  }
  (pcVar2->detail->field_6).x86.encoding.imm_offset = local_180.immediateOffset;
  if (local_180.immediateOffset != '\0' && (pcVar2->detail->field_6).x86.encoding.imm_size == '\0')
  {
    (pcVar2->detail->field_6).x86.encoding.imm_size = local_180.immediateSize;
    return _Var3;
  }
  return _Var3;
}

Assistant:

bool X86_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *_info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;
	InternalInstruction insn = {0};
	struct reader_info info;
	int ret;
	bool result;

	info.code = code;
	info.size = code_len;
	info.offset = address;

	if (instr->flat_insn->detail) {
		// instr->flat_insn->detail initialization: 3 alternatives

		// 1. The whole structure, this is how it's done in other arch disassemblers
		// Probably overkill since cs_detail is huge because of the 36 operands of ARM
		
		//memset(instr->flat_insn->detail, 0, sizeof(cs_detail));

		// 2. Only the part relevant to x86
		memset(instr->flat_insn->detail, 0, offsetof(cs_detail, x86) + sizeof(cs_x86));

		// 3. The relevant part except for x86.operands
		// sizeof(cs_x86) is 0x1c0, sizeof(x86.operands) is 0x180
		// marginally faster, should be okay since x86.op_count is set to 0

		//memset(instr->flat_insn->detail, 0, offsetof(cs_detail, x86)+offsetof(cs_x86, operands));
	}

	if (handle->mode & CS_MODE_16)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_16BIT);
	else if (handle->mode & CS_MODE_32)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_32BIT);
	else
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_64BIT);

	if (ret) {
		*size = (uint16_t)(insn.readerCursor - address);
		// handle some special cases here.
		// FIXME: fix this in the next major update.
		switch(*size) {
			default:
				break;
			case 2: {
						unsigned char b1 = 0, b2 = 0;

						reader(&info, &b1, address);
						reader(&info, &b2, address + 1);
						if (b1 == 0x0f && b2 == 0xff) {
							instr->Opcode = X86_UD0;
							instr->OpcodePub = X86_INS_UD0;
							strncpy(instr->assembly, "ud0", 4);
							if (instr->flat_insn->detail) {
								instr->flat_insn->detail->x86.opcode[0] = b1;
								instr->flat_insn->detail->x86.opcode[1] = b2;
							}
							return true;
						}
				}
				return false;
			case 4: {
						if (handle->mode != CS_MODE_16) {
							unsigned char b1 = 0, b2 = 0, b3 = 0, b4 = 0;

							reader(&info, &b1, address);
							reader(&info, &b2, address + 1);
							reader(&info, &b3, address + 2);
							reader(&info, &b4, address + 3);

							if (b1 == 0xf3 && b2 == 0x0f && b3 == 0x1e && b4 == 0xfa) {
								instr->Opcode = X86_ENDBR64;
								instr->OpcodePub = X86_INS_ENDBR64;
								strncpy(instr->assembly, "endbr64", 8);
								if (instr->flat_insn->detail) {
									instr->flat_insn->detail->x86.opcode[0] = b1;
									instr->flat_insn->detail->x86.opcode[1] = b2;
									instr->flat_insn->detail->x86.opcode[2] = b3;
									instr->flat_insn->detail->x86.opcode[3] = b4;
								}
								return true;
							} else if (b1 == 0xf3 && b2 == 0x0f && b3 == 0x1e && b4 == 0xfb) {
								instr->Opcode = X86_ENDBR32;
								instr->OpcodePub = X86_INS_ENDBR32;
								strncpy(instr->assembly, "endbr32", 8);
								if (instr->flat_insn->detail) {
									instr->flat_insn->detail->x86.opcode[0] = b1;
									instr->flat_insn->detail->x86.opcode[1] = b2;
									instr->flat_insn->detail->x86.opcode[2] = b3;
									instr->flat_insn->detail->x86.opcode[3] = b4;
								}
								return true;
							}
						}
				}
				return false;
		}

		return false;
	} else {
		*size = (uint16_t)insn.length;

		result = (!translateInstruction(instr, &insn)) ?  true : false;
		if (result) {
			// quick fix for #904. TODO: fix this properly in the next update
			if (handle->mode & CS_MODE_64) {
				if (instr->Opcode == X86_LES16rm || instr->Opcode == X86_LES32rm)
					// LES is invalid in x64
					return false;
				if (instr->Opcode == X86_LDS16rm || instr->Opcode == X86_LDS32rm)
					// LDS is invalid in x64
					return false;
			}

			instr->imm_size = insn.immSize;
			if (handle->detail) {
				update_pub_insn(instr->flat_insn, &insn, instr->x86_prefix);
			} else {
				// still copy all prefixes
				instr->x86_prefix[0] = insn.prefix0;
				instr->x86_prefix[1] = insn.prefix1;
				instr->x86_prefix[2] = insn.prefix2;
				instr->x86_prefix[3] = insn.prefix3;
			}
		}

		return result;
	}
}